

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_set_name(ggml_tensor *tensor,char *name)

{
  long lVar1;
  
  for (lVar1 = 0x100; (lVar1 != 0x13f && (name[lVar1 + -0x100] != '\0')); lVar1 = lVar1 + 1) {
    *(char *)((long)tensor->ne + lVar1 + -0x10) = name[lVar1 + -0x100];
  }
  *(undefined1 *)((long)tensor->ne + lVar1 + -0x10) = 0;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_name(struct ggml_tensor * tensor, const char * name) {
    size_t i;
    for (i = 0; i < sizeof(tensor->name) - 1 && name[i] != '\0'; i++) {
        tensor->name[i] = name[i];
    }
    tensor->name[i] = '\0';
    return tensor;
}